

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qutil.cc
# Opt level: O1

void print_utf8(unsigned_long val)

{
  _Alloc_hider _Var1;
  ostream *poVar2;
  unsigned_long uVar3;
  unsigned_long in_RDX;
  size_type sVar4;
  int in_R8D;
  bool error;
  size_t pos;
  string utf8;
  string result;
  bool local_79;
  size_t local_78;
  string local_70;
  string local_50;
  
  QUtil::toUTF8_abi_cxx11_(&local_50,(QUtil *)val,in_RDX);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"0x",2);
  QUtil::uint_to_string_base_abi_cxx11_(&local_70,(QUtil *)val,0x10,0,in_R8D);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_70._M_dataplus._M_p,local_70._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ->",3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  _Var1._M_p = local_50._M_dataplus._M_p;
  if (val < 0xfffe) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,local_50._M_dataplus._M_p,local_50._M_string_length);
  }
  else if (local_50._M_string_length != 0) {
    sVar4 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
      QUtil::int_to_string_base_abi_cxx11_
                (&local_70,(QUtil *)(ulong)(byte)_Var1._M_p[sVar4],0x10,2,in_R8D);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,local_70._M_dataplus._M_p,local_70._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      sVar4 = sVar4 + 1;
    } while (local_50._M_string_length != sVar4);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,anon_var_dwarf_aa0b,anon_var_dwarf_aa0b + 9);
  local_78 = 0;
  local_79 = false;
  uVar3 = QUtil::get_next_utf8_codepoint(&local_70,&local_78,&local_79);
  if (uVar3 != 0x3c0) {
    __assert_fail("QUtil::get_next_utf8_codepoint(utf8, pos, error) == 0x3c0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0xe9,"void print_utf8(unsigned long)");
  }
  if (local_78 != 2) {
    __assert_fail("pos == 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0xea,"void print_utf8(unsigned long)");
  }
  if (local_79 == true) {
    __assert_fail("!error",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0xeb,"void print_utf8(unsigned long)");
  }
  uVar3 = QUtil::get_next_utf8_codepoint(&local_70,&local_78,&local_79);
  if (uVar3 != 0xfffd) {
    __assert_fail("QUtil::get_next_utf8_codepoint(utf8, pos, error) == 0xfffd",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0xec,"void print_utf8(unsigned long)");
  }
  if (local_78 != 3) {
    __assert_fail("pos == 3",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0xed,"void print_utf8(unsigned long)");
  }
  if (local_79 == false) {
    __assert_fail("error",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0xee,"void print_utf8(unsigned long)");
  }
  uVar3 = QUtil::get_next_utf8_codepoint(&local_70,&local_78,&local_79);
  if (uVar3 != 0x30) {
    __assert_fail("QUtil::get_next_utf8_codepoint(utf8, pos, error) == 0x30",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0xef,"void print_utf8(unsigned long)");
  }
  if (local_78 != 4) {
    __assert_fail("pos == 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0xf0,"void print_utf8(unsigned long)");
  }
  if (local_79 == true) {
    __assert_fail("!error",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0xf1,"void print_utf8(unsigned long)");
  }
  uVar3 = QUtil::get_next_utf8_codepoint(&local_70,&local_78,&local_79);
  if (uVar3 != 0xfffd) {
    __assert_fail("QUtil::get_next_utf8_codepoint(utf8, pos, error) == 0xfffd",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0xf2,"void print_utf8(unsigned long)");
  }
  if (local_78 != 6) {
    __assert_fail("pos == 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0xf3,"void print_utf8(unsigned long)");
  }
  if (local_79 == false) {
    __assert_fail("error",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0xf4,"void print_utf8(unsigned long)");
  }
  uVar3 = QUtil::get_next_utf8_codepoint(&local_70,&local_78,&local_79);
  if (uVar3 != 0x30) {
    __assert_fail("QUtil::get_next_utf8_codepoint(utf8, pos, error) == 0x30",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0xf5,"void print_utf8(unsigned long)");
  }
  if (local_78 != 7) {
    __assert_fail("pos == 7",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0xf6,"void print_utf8(unsigned long)");
  }
  if (local_79 != true) {
    uVar3 = QUtil::get_next_utf8_codepoint(&local_70,&local_78,&local_79);
    if (uVar3 != 0x31) {
      __assert_fail("QUtil::get_next_utf8_codepoint(utf8, pos, error) == 0x31",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                    ,0xf8,"void print_utf8(unsigned long)");
    }
    if (local_78 != 8) {
      __assert_fail("pos == 8",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                    ,0xf9,"void print_utf8(unsigned long)");
    }
    if (local_79 == true) {
      __assert_fail("!error",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                    ,0xfa,"void print_utf8(unsigned long)");
    }
    uVar3 = QUtil::get_next_utf8_codepoint(&local_70,&local_78,&local_79);
    if (uVar3 == 0xfffd) {
      if (local_78 != 9) {
        __assert_fail("pos == 9",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                      ,0xfc,"void print_utf8(unsigned long)");
      }
      if (local_79 != false) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        return;
      }
      __assert_fail("error",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                    ,0xfd,"void print_utf8(unsigned long)");
    }
    __assert_fail("QUtil::get_next_utf8_codepoint(utf8, pos, error) == 0xfffd",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0xfb,"void print_utf8(unsigned long)");
  }
  __assert_fail("!error",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                ,0xf7,"void print_utf8(unsigned long)");
}

Assistant:

static void
print_utf8(unsigned long val)
{
    std::string result = QUtil::toUTF8(val);
    std::cout << "0x" << QUtil::uint_to_string_base(val, 16) << " ->";
    if (val < 0xfffe) {
        std::cout << " " << result;
    } else {
        // Emacs has trouble with utf-8 encoding files with characters
        // outside the 16-bit portion, so just show the character
        // values.
        for (auto const& ch: result) {
            std::cout << " "
                      << QUtil::int_to_string_base(
                             static_cast<int>(static_cast<unsigned char>(ch)), 16, 2);
        }
    }
    std::cout << std::endl;

    // Boundary conditions for QUtil::get_next_utf8_codepoint, which is
    // also tested indirectly through test_pdf_unicode.cc.
    std::string utf8 = "\xcf\x80\xcf\x30\xEF\xBF\x30\x31\xcf";
    size_t pos = 0;
    bool error = false;
    assert(QUtil::get_next_utf8_codepoint(utf8, pos, error) == 0x3c0);
    assert(pos == 2);
    assert(!error);
    assert(QUtil::get_next_utf8_codepoint(utf8, pos, error) == 0xfffd);
    assert(pos == 3);
    assert(error);
    assert(QUtil::get_next_utf8_codepoint(utf8, pos, error) == 0x30);
    assert(pos == 4);
    assert(!error);
    assert(QUtil::get_next_utf8_codepoint(utf8, pos, error) == 0xfffd);
    assert(pos == 6);
    assert(error);
    assert(QUtil::get_next_utf8_codepoint(utf8, pos, error) == 0x30);
    assert(pos == 7);
    assert(!error);
    assert(QUtil::get_next_utf8_codepoint(utf8, pos, error) == 0x31);
    assert(pos == 8);
    assert(!error);
    assert(QUtil::get_next_utf8_codepoint(utf8, pos, error) == 0xfffd);
    assert(pos == 9);
    assert(error);
}